

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O3

void loadCMakeData(QMultiHash<char,_QLatin1String> *types,QMultiHash<char,_QLatin1String> *keywords,
                  QMultiHash<char,_QLatin1String> *builtin,QMultiHash<char,_QLatin1String> *literals
                  ,QMultiHash<char,_QLatin1String> *other)

{
  if (cmakeDataInitialized == '\0') {
    initCMakeData();
    cmakeDataInitialized = '\x01';
  }
  QMultiHash<char,_QLatin1String>::operator=(types,&cmake_types);
  QMultiHash<char,_QLatin1String>::operator=(keywords,&cmake_keywords);
  QMultiHash<char,_QLatin1String>::operator=(builtin,&cmake_builtin);
  QMultiHash<char,_QLatin1String>::operator=(literals,&cmake_literals);
  QMultiHash<char,_QLatin1String>::operator=(other,&cmake_other);
  return;
}

Assistant:

void loadCMakeData(QMultiHash<char, QLatin1String> &types,
                   QMultiHash<char, QLatin1String> &keywords,
                   QMultiHash<char, QLatin1String> &builtin,
                   QMultiHash<char, QLatin1String> &literals,
                   QMultiHash<char, QLatin1String> &other) {
    if (!cmakeDataInitialized) {
        initCMakeData();
        cmakeDataInitialized = true;
    }
    types = cmake_types;
    keywords = cmake_keywords;
    builtin = cmake_builtin;
    literals = cmake_literals;
    other = cmake_other;
}